

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

double __thiscall
Imath_3_2::Matrix44<double>::fastMinor
          (Matrix44<double> *this,int r0,int r1,int r2,int c0,int c1,int c2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  
  lVar7 = (long)c2;
  dVar1 = this->x[r1][c1];
  dVar2 = this->x[r2][lVar7];
  dVar3 = this->x[r1][lVar7];
  dVar4 = this->x[r2][c1];
  dVar5 = this->x[r2][c0];
  dVar6 = this->x[r1][c0];
  return (dVar6 * dVar4 - dVar5 * dVar1) * this->x[r0][lVar7] +
         (dVar1 * dVar2 - dVar4 * dVar3) * this->x[r0][c0] +
         (dVar3 * dVar5 - dVar2 * dVar6) * this->x[r0][c1];
}

Assistant:

IMATH_HOSTDEVICE constexpr inline T
Matrix44<T>::fastMinor (
    const int r0,
    const int r1,
    const int r2,
    const int c0,
    const int c1,
    const int c2) const IMATH_NOEXCEPT
{
    return x[r0][c0] * (x[r1][c1] * x[r2][c2] - x[r1][c2] * x[r2][c1]) +
           x[r0][c1] * (x[r1][c2] * x[r2][c0] - x[r1][c0] * x[r2][c2]) +
           x[r0][c2] * (x[r1][c0] * x[r2][c1] - x[r1][c1] * x[r2][c0]);
}